

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

Error miniros::changeCurrentDirectory(string *path)

{
  bool bVar1;
  Error_t EVar2;
  ostream *poVar3;
  path local_40;
  
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_40,path,auto_format);
  bVar1 = std::filesystem::exists(&local_40);
  std::filesystem::__cxx11::path::~path(&local_40);
  if (bVar1) {
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              (&local_40,path,auto_format);
    std::filesystem::current_path(&local_40);
    std::filesystem::__cxx11::path::~path(&local_40);
    EVar2 = Ok;
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Failed to change current directory \"");
    poVar3 = std::operator<<(poVar3,(string *)path);
    poVar3 = std::operator<<(poVar3,"\" - path do not exists");
    std::endl<char,std::char_traits<char>>(poVar3);
    EVar2 = SystemError;
  }
  return (Error)EVar2;
}

Assistant:

Error changeCurrentDirectory(const std::string& path)
{
  if (!std::filesystem::exists(path)) {
    std::cerr << "Failed to change current directory \"" << path << "\" - path do not exists" << std::endl;
    return Error::SystemError;
  }
  std::filesystem::current_path(path);
  return Error::Ok;
}